

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

int stats_mutexes_reset_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  malloc_mutex_t *mutex;
  long lVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  szind_t j;
  ulong uVar10;
  ulong uVar11;
  void *pvVar12;
  pthread_mutex_t *__mutex;
  mutex_prof_data_t *data;
  
  iVar4 = pthread_mutex_trylock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  if (iVar4 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&ctl_mtx);
    ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  ctl_mtx.field_0.field_0.prof_data.n_lock_ops = ctl_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(ctl_mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    ctl_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(ctl_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    ctl_mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  duckdb_je_malloc_mutex_prof_data_reset((tsdn_t *)tsd,&ctl_mtx);
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  iVar4 = pthread_mutex_trylock
                    ((pthread_mutex_t *)((long)&duckdb_je_background_thread_lock.field_0 + 0x48));
  if (iVar4 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&duckdb_je_background_thread_lock);
    duckdb_je_background_thread_lock.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  duckdb_je_background_thread_lock.field_0.field_0.prof_data.n_lock_ops =
       duckdb_je_background_thread_lock.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(duckdb_je_background_thread_lock.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    duckdb_je_background_thread_lock.field_0.witness.link.qre_prev =
         (witness_t *)
         (duckdb_je_background_thread_lock.field_0.field_0.prof_data.n_owner_switches + 1);
    duckdb_je_background_thread_lock.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  duckdb_je_malloc_mutex_prof_data_reset((tsdn_t *)tsd,&duckdb_je_background_thread_lock);
  duckdb_je_background_thread_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&duckdb_je_background_thread_lock.field_0 + 0x48));
  uVar5 = duckdb_je_narenas_total_get();
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      pvVar7 = duckdb_je_arenas[uVar6].repr;
      if (pvVar7 == (void *)0x0) {
        pvVar7 = (void *)0x0;
      }
      if (pvVar7 != (void *)0x0) {
        iVar4 = pthread_mutex_trylock((pthread_mutex_t *)((long)pvVar7 + 0x2980));
        if (iVar4 != 0) {
          duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)((long)pvVar7 + 0x2938));
          *(undefined1 *)((long)pvVar7 + 0x2978) = 1;
        }
        *(long *)((long)pvVar7 + 0x2970) = *(long *)((long)pvVar7 + 0x2970) + 1;
        if (*(tsd_t **)((long)pvVar7 + 0x2968) != tsd) {
          *(tsd_t **)((long)pvVar7 + 0x2968) = tsd;
          *(long *)((long)pvVar7 + 0x2960) = *(long *)((long)pvVar7 + 0x2960) + 1;
        }
        duckdb_je_malloc_mutex_prof_data_reset
                  ((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar7 + 0x2938));
        *(undefined1 *)((long)pvVar7 + 0x2978) = 0;
        pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar7 + 0x2980));
        iVar4 = pthread_mutex_trylock((pthread_mutex_t *)((long)pvVar7 + 0x13410));
        if (iVar4 != 0) {
          duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)((long)pvVar7 + 0x133c8));
          *(undefined1 *)((long)pvVar7 + 0x13408) = 1;
        }
        *(long *)((long)pvVar7 + 0x13400) = *(long *)((long)pvVar7 + 0x13400) + 1;
        if (*(tsd_t **)((long)pvVar7 + 0x133f8) != tsd) {
          *(tsd_t **)((long)pvVar7 + 0x133f8) = tsd;
          *(long *)((long)pvVar7 + 0x133f0) = *(long *)((long)pvVar7 + 0x133f0) + 1;
        }
        duckdb_je_malloc_mutex_prof_data_reset
                  ((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar7 + 0x133c8));
        *(undefined1 *)((long)pvVar7 + 0x13408) = 0;
        pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar7 + 0x13410));
        iVar4 = pthread_mutex_trylock((pthread_mutex_t *)((long)pvVar7 + 0x2a40));
        if (iVar4 != 0) {
          duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)((long)pvVar7 + 0x29f8));
          *(undefined1 *)((long)pvVar7 + 0x2a38) = 1;
        }
        *(long *)((long)pvVar7 + 0x2a30) = *(long *)((long)pvVar7 + 0x2a30) + 1;
        if (*(tsd_t **)((long)pvVar7 + 0x2a28) != tsd) {
          *(tsd_t **)((long)pvVar7 + 0x2a28) = tsd;
          *(long *)((long)pvVar7 + 0x2a20) = *(long *)((long)pvVar7 + 0x2a20) + 1;
        }
        duckdb_je_malloc_mutex_prof_data_reset
                  ((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar7 + 0x29f8));
        *(undefined1 *)((long)pvVar7 + 0x2a38) = 0;
        pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar7 + 0x2a40));
        iVar4 = pthread_mutex_trylock((pthread_mutex_t *)((long)pvVar7 + 0x7630));
        if (iVar4 != 0) {
          duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)((long)pvVar7 + 0x75e8));
          *(undefined1 *)((long)pvVar7 + 0x7628) = 1;
        }
        *(long *)((long)pvVar7 + 0x7620) = *(long *)((long)pvVar7 + 0x7620) + 1;
        if (*(tsd_t **)((long)pvVar7 + 0x7618) != tsd) {
          *(tsd_t **)((long)pvVar7 + 0x7618) = tsd;
          *(long *)((long)pvVar7 + 0x7610) = *(long *)((long)pvVar7 + 0x7610) + 1;
        }
        duckdb_je_malloc_mutex_prof_data_reset
                  ((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar7 + 0x75e8));
        *(undefined1 *)((long)pvVar7 + 0x7628) = 0;
        pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar7 + 0x7630));
        iVar4 = pthread_mutex_trylock((pthread_mutex_t *)((long)pvVar7 + 0xc220));
        if (iVar4 != 0) {
          duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)((long)pvVar7 + 0xc1d8));
          *(undefined1 *)((long)pvVar7 + 0xc218) = 1;
        }
        *(long *)((long)pvVar7 + 0xc210) = *(long *)((long)pvVar7 + 0xc210) + 1;
        if (*(tsd_t **)((long)pvVar7 + 0xc208) != tsd) {
          *(tsd_t **)((long)pvVar7 + 0xc208) = tsd;
          *(long *)((long)pvVar7 + 0xc200) = *(long *)((long)pvVar7 + 0xc200) + 1;
        }
        duckdb_je_malloc_mutex_prof_data_reset
                  ((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar7 + 0xc1d8));
        *(undefined1 *)((long)pvVar7 + 0xc218) = 0;
        pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar7 + 0xc220));
        iVar4 = pthread_mutex_trylock((pthread_mutex_t *)((long)pvVar7 + 0x10f20));
        if (iVar4 != 0) {
          duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)((long)pvVar7 + 0x10ed8));
          *(undefined1 *)((long)pvVar7 + 0x10f18) = 1;
        }
        *(long *)((long)pvVar7 + 0x10f10) = *(long *)((long)pvVar7 + 0x10f10) + 1;
        if (*(tsd_t **)((long)pvVar7 + 0x10f08) != tsd) {
          *(tsd_t **)((long)pvVar7 + 0x10f08) = tsd;
          *(long *)((long)pvVar7 + 0x10f00) = *(long *)((long)pvVar7 + 0x10f00) + 1;
        }
        duckdb_je_malloc_mutex_prof_data_reset
                  ((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar7 + 0x10ed8));
        *(undefined1 *)((long)pvVar7 + 0x10f18) = 0;
        pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar7 + 0x10f20));
        iVar4 = pthread_mutex_trylock((pthread_mutex_t *)((long)pvVar7 + 0x11618));
        if (iVar4 != 0) {
          duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)((long)pvVar7 + 0x115d0));
          *(undefined1 *)((long)pvVar7 + 0x11610) = 1;
        }
        *(long *)((long)pvVar7 + 0x11608) = *(long *)((long)pvVar7 + 0x11608) + 1;
        if (*(tsd_t **)((long)pvVar7 + 0x11600) != tsd) {
          *(tsd_t **)((long)pvVar7 + 0x11600) = tsd;
          *(long *)((long)pvVar7 + 0x115f8) = *(long *)((long)pvVar7 + 0x115f8) + 1;
        }
        duckdb_je_malloc_mutex_prof_data_reset
                  ((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar7 + 0x115d0));
        *(undefined1 *)((long)pvVar7 + 0x11610) = 0;
        pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar7 + 0x11618));
        iVar4 = pthread_mutex_trylock((pthread_mutex_t *)((long)pvVar7 + 0x2900));
        if (iVar4 != 0) {
          duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)((long)pvVar7 + 0x28b8));
          *(undefined1 *)((long)pvVar7 + 0x28f8) = 1;
        }
        *(long *)((long)pvVar7 + 0x28f0) = *(long *)((long)pvVar7 + 0x28f0) + 1;
        if (*(tsd_t **)((long)pvVar7 + 0x28e8) != tsd) {
          *(tsd_t **)((long)pvVar7 + 0x28e8) = tsd;
          *(long *)((long)pvVar7 + 0x28e0) = *(long *)((long)pvVar7 + 0x28e0) + 1;
        }
        duckdb_je_malloc_mutex_prof_data_reset
                  ((tsdn_t *)tsd,(malloc_mutex_t *)((long)pvVar7 + 0x28b8));
        *(undefined1 *)((long)pvVar7 + 0x28f8) = 0;
        pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar7 + 0x2900));
        lVar3 = *(long *)((long)pvVar7 + 0x13470);
        iVar4 = pthread_mutex_trylock((pthread_mutex_t *)(lVar3 + 0x68));
        if (iVar4 != 0) {
          duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)(lVar3 + 0x20));
          *(undefined1 *)(lVar3 + 0x60) = 1;
        }
        *(long *)(lVar3 + 0x58) = *(long *)(lVar3 + 0x58) + 1;
        if (*(tsd_t **)(lVar3 + 0x50) != tsd) {
          *(tsd_t **)(lVar3 + 0x50) = tsd;
          *(long *)(lVar3 + 0x48) = *(long *)(lVar3 + 0x48) + 1;
        }
        duckdb_je_malloc_mutex_prof_data_reset
                  ((tsdn_t *)tsd,(malloc_mutex_t *)(*(long *)((long)pvVar7 + 0x13470) + 0x20));
        lVar3 = *(long *)((long)pvVar7 + 0x13470);
        *(undefined1 *)(lVar3 + 0x60) = 0;
        pthread_mutex_unlock((pthread_mutex_t *)(lVar3 + 0x68));
        uVar10 = 0;
        do {
          if (duckdb_je_bin_infos[uVar10].n_shards != 0) {
            uVar11 = 0;
            pvVar9 = pvVar7;
            pvVar12 = pvVar7;
            do {
              pvVar8 = pvVar12;
              if (uVar10 < duckdb_je_bin_info_nbatched_sizes) {
                pvVar8 = pvVar9;
              }
              mutex = (malloc_mutex_t *)((long)pvVar8 + (ulong)duckdb_je_arena_bin_offsets[uVar10]);
              __mutex = (pthread_mutex_t *)
                        ((long)pvVar8 + (ulong)duckdb_je_arena_bin_offsets[uVar10] + 0x48);
              iVar4 = pthread_mutex_trylock(__mutex);
              if (iVar4 != 0) {
                duckdb_je_malloc_mutex_lock_slow(mutex);
                (mutex->field_0).field_0.locked.repr = true;
              }
              puVar1 = &(mutex->field_0).field_0.prof_data.n_lock_ops;
              *puVar1 = *puVar1 + 1;
              if (&((mutex->field_0).field_0.prof_data.prev_owner)->tsd != tsd) {
                (mutex->field_0).field_0.prof_data.prev_owner = (tsdn_t *)tsd;
                ppwVar2 = &(mutex->field_0).witness.link.qre_prev;
                *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
              }
              duckdb_je_malloc_mutex_prof_data_reset((tsdn_t *)tsd,mutex);
              (mutex->field_0).field_0.locked.repr = false;
              pthread_mutex_unlock(__mutex);
              uVar11 = uVar11 + 1;
              pvVar9 = (void *)((long)pvVar9 + 0x288);
              pvVar12 = (void *)((long)pvVar12 + 0x100);
            } while (uVar11 < duckdb_je_bin_infos[uVar10].n_shards);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != 0x24);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar5);
  }
  return 0;
}

Assistant:

static int
stats_mutexes_reset_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp,
    void *newp, size_t newlen) {
	if (!config_stats) {
		return ENOENT;
	}

	tsdn_t *tsdn = tsd_tsdn(tsd);

#define MUTEX_PROF_RESET(mtx)						\
    malloc_mutex_lock(tsdn, &mtx);					\
    malloc_mutex_prof_data_reset(tsdn, &mtx);				\
    malloc_mutex_unlock(tsdn, &mtx);

	/* Global mutexes: ctl and prof. */
	MUTEX_PROF_RESET(ctl_mtx);
	if (have_background_thread) {
		MUTEX_PROF_RESET(background_thread_lock);
	}
	if (config_prof && opt_prof) {
		MUTEX_PROF_RESET(bt2gctx_mtx);
		MUTEX_PROF_RESET(tdatas_mtx);
		MUTEX_PROF_RESET(prof_dump_mtx);
		MUTEX_PROF_RESET(prof_recent_alloc_mtx);
		MUTEX_PROF_RESET(prof_recent_dump_mtx);
		MUTEX_PROF_RESET(prof_stats_mtx);
	}

	/* Per arena mutexes. */
	unsigned n = narenas_total_get();

	for (unsigned i = 0; i < n; i++) {
		arena_t *arena = arena_get(tsdn, i, false);
		if (!arena) {
			continue;
		}
		MUTEX_PROF_RESET(arena->large_mtx);
		MUTEX_PROF_RESET(arena->pa_shard.edata_cache.mtx);
		MUTEX_PROF_RESET(arena->pa_shard.pac.ecache_dirty.mtx);
		MUTEX_PROF_RESET(arena->pa_shard.pac.ecache_muzzy.mtx);
		MUTEX_PROF_RESET(arena->pa_shard.pac.ecache_retained.mtx);
		MUTEX_PROF_RESET(arena->pa_shard.pac.decay_dirty.mtx);
		MUTEX_PROF_RESET(arena->pa_shard.pac.decay_muzzy.mtx);
		MUTEX_PROF_RESET(arena->tcache_ql_mtx);
		MUTEX_PROF_RESET(arena->base->mtx);

		for (szind_t j = 0; j < SC_NBINS; j++) {
			for (unsigned k = 0; k < bin_infos[j].n_shards; k++) {
				bin_t *bin = arena_get_bin(arena, j, k);
				MUTEX_PROF_RESET(bin->lock);
			}
		}
	}
#undef MUTEX_PROF_RESET
	return 0;
}